

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

lu_byte luaH_get(Table *t,TValue *key,TValue *res)

{
  int *piVar1;
  lu_byte lVar2;
  int iVar3;
  TValue *io2;
  Node *pNVar4;
  byte bVar5;
  Node *pNVar6;
  TValue *io1;
  lua_Integer k;
  lua_Integer local_20;
  
  bVar5 = key->tt_ & 0x3f;
  if (bVar5 < 4) {
    pNVar4 = (Node *)&absentkey;
    if ((key->tt_ & 0x3f) == 0) goto LAB_0011c482;
    if (bVar5 == 3) {
      lVar2 = luaH_getint(t,(key->value_).i,res);
      return lVar2;
    }
  }
  else if (bVar5 == 0x13) {
    iVar3 = luaV_flttointeger((key->value_).n,&local_20,F2Ieq);
    if (iVar3 != 0) {
      lVar2 = luaH_getint(t,local_20,res);
      return lVar2;
    }
  }
  else if (bVar5 == 4) {
    pNVar6 = t->node + (~(-1 << (t->lsizenode & 0x1f)) &
                       *(uint *)&((GCObject *)(key->value_).f)->field_0xc);
    do {
      if (((pNVar6->u).key_tt == 'D') &&
         (pNVar4 = pNVar6, (pNVar6->u).key_val.gc == (GCObject *)(key->value_).f)) break;
      piVar1 = &(pNVar6->u).next;
      pNVar6 = pNVar6 + *piVar1;
      pNVar4 = (Node *)&absentkey;
    } while ((long)*piVar1 != 0);
    goto LAB_0011c482;
  }
  pNVar4 = (Node *)getgeneric(t,key,0);
LAB_0011c482:
  bVar5 = (pNVar4->u).tt_;
  if ((bVar5 & 0xf) != 0) {
    res->value_ = (pNVar4->u).value_;
    bVar5 = (pNVar4->u).tt_;
    res->tt_ = bVar5;
  }
  return bVar5 & 0x3f;
}

Assistant:

lu_byte luaH_get (Table *t, const TValue *key, TValue *res) {
  const TValue *slot;
  switch (ttypetag(key)) {
    case LUA_VSHRSTR:
      slot = luaH_Hgetshortstr(t, tsvalue(key));
      break;
    case LUA_VNUMINT:
      return luaH_getint(t, ivalue(key), res);
    case LUA_VNIL:
      slot = &absentkey;
      break;
    case LUA_VNUMFLT: {
      lua_Integer k;
      if (luaV_flttointeger(fltvalue(key), &k, F2Ieq)) /* integral index? */
        return luaH_getint(t, k, res);  /* use specialized version */
      /* else... */
    }  /* FALLTHROUGH */
    default:
      slot = getgeneric(t, key, 0);
      break;
  }
  return finishnodeget(slot, res);
}